

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::BeginAssertionInst::Exec
          (BeginAssertionInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  Label LVar1;
  size_t sVar2;
  code *pcVar3;
  bool bVar4;
  Label LVar5;
  undefined4 *puVar6;
  Label *pLVar7;
  char *pcVar8;
  
  if ((BeginAssertionInst *)*instPointer != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x1123,"(instPointer == (uint8*)this)","instPointer == (uint8*)this");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  if ((this->super_NegationMixin).isNegation == false) {
    Matcher::SaveInnerGroups
              (matcher,(this->super_BodyGroupsMixin).minBodyGroupId,
               (this->super_BodyGroupsMixin).maxBodyGroupId,false,input,contStack);
  }
  pLVar7 = (Label *)ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>::Push
                              (&assertionStack->
                                super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>
                              );
  LVar5 = Matcher::InstPointerToLabel(matcher,*instPointer);
  LVar1 = *inputOffset;
  sVar2 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.nextTop;
  *pLVar7 = LVar5;
  pLVar7[1] = LVar1;
  *(size_t *)(pLVar7 + 2) = sVar2;
  pcVar8 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
           Push<UnifiedRegex::PopAssertionCont>
                     (&contStack->
                       super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
  pcVar8[8] = '\x06';
  *(undefined ***)pcVar8 = &PTR_Print_013e02d8;
  Matcher::PushStats(matcher,contStack,input);
  *instPointer = *instPointer + 0xe;
  return false;
}

Assistant:

inline bool BeginAssertionInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        Assert(instPointer == (uint8*)this);

        if (!isNegation)
        {
            // If the positive assertion binds some groups then on success any RestoreGroup continuations pushed
            // in the assertion body will be cut. Hence if the entire assertion is backtracked over we must restore
            // the current inner group bindings.
            matcher.SaveInnerGroups(minBodyGroupId, maxBodyGroupId, false, input, contStack);
        }

        PUSHA(assertionStack, AssertionInfo, matcher.InstPointerToLabel(instPointer), inputOffset, contStack.Position());
        PUSH(contStack, PopAssertionCont);
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.PushStats(contStack, input);
#endif

        instPointer += sizeof(*this);
        return false;
    }